

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cupdlp_linalg.c
# Opt level: O0

double GenNorm(double *x,cupdlp_int n,cupdlp_float p)

{
  int in_ESI;
  long in_RDI;
  double in_XMM0_Qa;
  double dVar1;
  int i;
  double nrm;
  cupdlp_int in_stack_ffffffffffffffcc;
  undefined4 in_stack_ffffffffffffffd0;
  undefined4 in_stack_ffffffffffffffd4;
  int iVar2;
  undefined8 local_28;
  undefined8 local_8;
  
  if ((in_XMM0_Qa != 2.0) || (NAN(in_XMM0_Qa))) {
    if ((in_XMM0_Qa != INFINITY) || (NAN(in_XMM0_Qa))) {
      local_28 = 0.0;
      for (iVar2 = 0; iVar2 < in_ESI; iVar2 = iVar2 + 1) {
        dVar1 = pow(ABS(*(double *)(in_RDI + (long)iVar2 * 8)),in_XMM0_Qa);
        local_28 = dVar1 + local_28;
      }
      local_8 = pow(local_28,1.0 / in_XMM0_Qa);
    }
    else {
      local_8 = infNorm((double *)CONCAT44(in_stack_ffffffffffffffd4,in_stack_ffffffffffffffd0),
                        in_stack_ffffffffffffffcc);
    }
  }
  else {
    local_8 = twoNorm((double *)CONCAT44(in_stack_ffffffffffffffd4,in_stack_ffffffffffffffd0),
                      in_stack_ffffffffffffffcc);
  }
  return local_8;
}

Assistant:

double GenNorm(double *x, cupdlp_int n, cupdlp_float p) {
  if (p == 2.0) {
    return twoNorm(x, n);
  } else if (p == INFINITY) {
    return infNorm(x, n);
  } else {
    double nrm = 0.0;

    for (int i = 0; i < n; ++i) {
      nrm += pow(fabs(x[i]), p);
    }

    return pow(nrm, 1.0 / p);
  }
}